

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
          (RepeatedPtrFieldBase *this)

{
  void **ppvVar1;
  int v1;
  void **ppvVar2;
  Nullable<const_char_*> failure_msg;
  long lVar3;
  LogMessageFatal LStack_38;
  
  v1 = this->current_size_;
  ppvVar2 = elements(this);
  failure_msg = absl::lts_20250127::log_internal::Check_GTImpl(v1,0,"n > 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    lVar3 = 0;
    do {
      ppvVar1 = ppvVar2 + lVar3;
      lVar3 = lVar3 + 1;
      (**(code **)(**ppvVar1 + 0x10))();
    } while (lVar3 < v1);
    this->current_size_ = 0;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,0x2ca,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
}

Assistant:

PROTOBUF_NOINLINE void ClearNonEmpty() {
    const int n = current_size_;
    void* const* elems = elements();
    int i = 0;
    ABSL_DCHECK_GT(n, 0);
    // do/while loop to avoid initial test because we know n > 0
    do {
      TypeHandler::Clear(cast<TypeHandler>(elems[i++]));
    } while (i < n);
    ExchangeCurrentSize(0);
  }